

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

bool cmcmd::SymlinkInternal(string *file,string *link)

{
  bool bVar1;
  string linktext;
  string sStack_38;
  
  bVar1 = cmsys::SystemTools::FileExists(link);
  if (!bVar1) {
    bVar1 = cmsys::SystemTools::FileIsSymlink(link);
    if (!bVar1) goto LAB_00145823;
  }
  cmsys::SystemTools::RemoveFile(link);
LAB_00145823:
  cmsys::SystemTools::GetFilenameName(&sStack_38,file);
  bVar1 = cmSystemTools::CreateSymlink(&sStack_38,link,(string *)0x0);
  std::__cxx11::string::~string((string *)&sStack_38);
  return bVar1;
}

Assistant:

bool cmcmd::SymlinkInternal(std::string const& file, std::string const& link)
{
  if (cmSystemTools::FileExists(link) || cmSystemTools::FileIsSymlink(link)) {
    cmSystemTools::RemoveFile(link);
  }
#if defined(_WIN32) && !defined(__CYGWIN__)
  return cmSystemTools::CopyFileAlways(file, link);
#else
  std::string linktext = cmSystemTools::GetFilenameName(file);
  return cmSystemTools::CreateSymlink(linktext, link);
#endif
}